

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

LaneArray<4> * __thiscall
wasm::Literal::getLanesF32x4(LaneArray<4> *__return_storage_ptr__,Literal *this)

{
  anon_union_16_5_9943fe1e_for_Literal_0 *this_00;
  Literal *in_RDX;
  long lVar1;
  anon_union_16_5_9943fe1e_for_Literal_0 local_40;
  undefined8 local_30;
  
  getLanes<int,4>(__return_storage_ptr__,(wasm *)this,in_RDX);
  lVar1 = 0;
  do {
    if (*(long *)((long)&__return_storage_ptr__->_M_elems[0].type.id + lVar1) != 2) {
      __assert_fail("type == Type::i32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                    ,0x148,"Literal wasm::Literal::castToF32()");
    }
    this_00 = (anon_union_16_5_9943fe1e_for_Literal_0 *)
              ((long)&__return_storage_ptr__->_M_elems[0].field_0 + lVar1);
    local_30 = 4;
    local_40.i32 = ((anon_union_16_5_9943fe1e_for_Literal_0 *)&(this_00->func).super_IString)->i32;
    if (this_00 != &local_40) {
      ~Literal((Literal *)&this_00->func);
      Literal((Literal *)&this_00->func,(Literal *)&local_40.func);
    }
    ~Literal((Literal *)&local_40.func);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x60);
  return __return_storage_ptr__;
}

Assistant:

LaneArray<4> Literal::getLanesF32x4() const {
  auto lanes = getLanesI32x4();
  for (size_t i = 0; i < lanes.size(); ++i) {
    lanes[i] = lanes[i].castToF32();
  }
  return lanes;
}